

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::activation_object::activation_object
          (activation_object *this,global_object *global,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  gc_heap *pgVar2;
  object *poVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  gc_vector<mjs::activation_object::param> *this_00;
  const_reference pvVar7;
  size_type sVar8;
  uint32_t index;
  undefined1 auVar9 [16];
  wstring_view wVar10;
  size_type local_228;
  bool local_1c1;
  wstring_view local_1a8;
  string local_198;
  size_type local_188;
  size_t i_1;
  string local_158;
  wstring_view local_148;
  string local_138;
  wstring_view local_128;
  string local_118;
  wstring local_108;
  wstring_view local_e8;
  undefined1 local_d8 [8];
  string is;
  undefined1 local_c0 [4];
  uint32_t i;
  string local_98;
  gc_heap_ptr_untracked<mjs::object,_true> local_84;
  undefined1 local_80 [8];
  object_ptr as;
  undefined1 local_68 [3];
  bool strict;
  version ver;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true> local_58 [4];
  object_ptr local_48;
  string local_38;
  undefined8 local_28;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *param_names_local;
  global_object *global_local;
  activation_object *this_local;
  
  local_28 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)param_names;
  param_names_local =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)global;
  global_local = (global_object *)this;
  (*(global->super_object)._vptr_object[0x13])(&local_38,global,"Activation");
  (**(code **)((long)&(param_names_local->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[2].field_2 + 8))(&local_48);
  object::object(&this->super_object,&local_38,&local_48);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_48);
  string::~string(&local_38);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_0028b030;
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->arguments_);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::gc_heap_ptr_untracked
            (&this->params_);
  bVar1 = std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)args_local);
  if (!bVar1) {
    pgVar2 = object::heap(&this->super_object);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)args_local);
    gc_vector<mjs::activation_object::param>::make((gc_heap *)local_68,(uint32_t)pgVar2);
    gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::
    gc_heap_ptr_untracked
              (local_58,(gc_heap_ptr<mjs::gc_vector<mjs::activation_object::param>_> *)local_68);
    (this->params_).pos_ = local_58[0].pos_;
    gc_heap_ptr<mjs::gc_vector<mjs::activation_object::param>_>::~gc_heap_ptr
              ((gc_heap_ptr<mjs::gc_vector<mjs::activation_object::param>_> *)local_68);
  }
  as.super_gc_heap_ptr_untyped._12_4_ =
       global_object::language_version((global_object *)param_names_local);
  local_1c1 = false;
  if (1 < (int)as.super_gc_heap_ptr_untyped._12_4_) {
    local_1c1 = global_object::strict_mode((global_object *)param_names_local);
  }
  as.super_gc_heap_ptr_untyped.pos_._3_1_ = local_1c1;
  global_object::make_arguments_array((global_object *)local_80);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked
            (&local_84,(gc_heap_ptr<mjs::object> *)local_80);
  (this->arguments_).pos_ = local_84.pos_;
  poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_80);
  (**(code **)((long)&(param_names_local->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[4].field_2 + 8))
            (&local_98,param_names_local,"length");
  sVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                    ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_28);
  auVar9._8_4_ = (int)(sVar4 >> 0x20);
  auVar9._0_8_ = sVar4;
  auVar9._12_4_ = 0x45300000;
  value::value((value *)local_c0,
               (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  (*poVar3->_vptr_object[1])(poVar3,&local_98,local_c0,2);
  value::~value((value *)local_c0);
  string::~string(&local_98);
  is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_;
    sVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                      ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_28);
    if (sVar4 <= uVar5) break;
    pgVar2 = object::heap(&this->super_object);
    index_string_abi_cxx11_
              (&local_108,
               (mjs *)(ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                                   _12_4_,index);
    wVar10 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_108);
    local_e8 = wVar10;
    string::string((string *)local_d8,pgVar2,&local_e8);
    std::__cxx11::wstring::~wstring((wstring *)&local_108);
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_80);
    pvVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_28,
                        (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                                     _12_4_);
    (*poVar3->_vptr_object[1])
              (poVar3,local_d8,pvVar6,
               (ulong)((uint)((int)as.super_gc_heap_ptr_untyped._12_4_ < 2) * 2));
    uVar5 = (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)args_local);
    if (uVar5 < sVar4) {
      if ((as.super_gc_heap_ptr_untyped.pos_._3_1_ & 1) == 0) {
        pgVar2 = object::heap(&this->super_object);
        this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::
                  dereference(&this->params_,pgVar2);
        pgVar2 = object::heap(&this->super_object);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                               *)args_local,
                              (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.
                                           super_gc_heap_ptr_untyped._12_4_);
        wVar10 = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pvVar7);
        local_128 = wVar10;
        string::string(&local_118,pgVar2,&local_128);
        gc_vector<mjs::activation_object::param>::emplace_back<mjs::string,mjs::string&>
                  (this_00,&local_118,(string *)local_d8);
        string::~string(&local_118);
      }
      else {
        pgVar2 = object::heap(&this->super_object);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                               *)args_local,
                              (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.
                                           super_gc_heap_ptr_untyped._12_4_);
        wVar10 = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pvVar7);
        local_148 = wVar10;
        string::string(&local_138,pgVar2,&local_148);
        pvVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                           ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_28,
                            (ulong)(uint)is.super_gc_heap_ptr<mjs::gc_string>.
                                         super_gc_heap_ptr_untyped._12_4_);
        object::put(&this->super_object,&local_138,pvVar6,dont_delete);
        string::~string(&local_138);
      }
    }
    string::~string((string *)local_d8);
    is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ =
         is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ + 1;
  }
  (**(code **)((long)&(param_names_local->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[4].field_2 + 8))
            (&local_158,param_names_local,"arguments");
  value::value((value *)&i_1,(object_ptr *)local_80);
  object::put(&this->super_object,&local_158,(value *)&i_1,dont_delete);
  value::~value((value *)&i_1);
  string::~string(&local_158);
  if ((as.super_gc_heap_ptr_untyped.pos_._3_1_ & 1) == 0) {
    local_228 = 0;
  }
  else {
    local_228 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                          ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_28);
  }
  local_188 = local_228;
  while( true ) {
    sVar4 = local_188;
    sVar8 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)args_local);
    if (sVar8 <= sVar4) break;
    pgVar2 = object::heap(&this->super_object);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           *)args_local,local_188);
    wVar10 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pvVar7);
    local_1a8 = wVar10;
    string::string(&local_198,pgVar2,&local_1a8);
    object::put(&this->super_object,&local_198,(value *)value::undefined,dont_delete);
    string::~string(&local_198);
    local_188 = local_188 + 1;
  }
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_80);
  return;
}

Assistant:

explicit activation_object(global_object& global, const std::vector<std::wstring>& param_names, const std::vector<value>& args)
        : object(global.common_string("Activation"), global.object_prototype()) {

        if (!param_names.empty()) {
            params_ = gc_vector<param>::make(heap(), static_cast<uint32_t>(param_names.size()));
        }

        const auto ver    = global.language_version();
        const bool strict = ver >= version::es5 && global.strict_mode();

        // Arguments array
        auto as = global.make_arguments_array();
        arguments_ = as;
        as->put(global.common_string("length"), value{static_cast<double>(args.size())}, property_attribute::dont_enum);
        for (uint32_t i = 0; i < args.size(); ++i) {
            string is{heap(), index_string(i)};
            as->put(is, args[i], ver >= version::es5 ? property_attribute::none : property_attribute::dont_enum);

            if (i < param_names.size()) {
                if (!strict) {
                    // Handle the (ugly) fact that the arguments array aliases the parameters
                    params_.dereference(heap()).emplace_back(string{heap(), param_names[i]}, is);
                } else {
                    object::put(string{heap(), param_names[i]}, args[i], property_attribute::dont_delete);
                }
            }
        }

        object::put(global.common_string("arguments"), value{as}, property_attribute::dont_delete);

        // Add placeholders (see note above)
        for (size_t i = strict ? args.size() : 0; i < param_names.size(); ++i) {
            object::put(string{heap(), param_names[i]}, value::undefined, property_attribute::dont_delete);
        }
    }